

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.cc
# Opt level: O0

void ** __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::InternalExtend
          (RepeatedPtrFieldBase *this,int extend_amount)

{
  int iVar1;
  int *piVar2;
  ulong uVar3;
  unsigned_long uVar4;
  Rep *pRVar5;
  int in_ESI;
  RepeatedPtrFieldBase *in_RDI;
  size_t old_size;
  int old_total_size;
  size_t bytes;
  Arena *arena;
  Rep *old_rep;
  int new_size;
  size_t n;
  undefined4 in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe1c;
  LogMessage *in_stack_fffffffffffffe20;
  type_info *in_stack_fffffffffffffe28;
  LogMessage *in_stack_fffffffffffffe30;
  int local_fc;
  Arena *local_f8;
  Rep *local_f0;
  int local_e8 [4];
  void **local_d8;
  byte local_b9;
  ulong local_80;
  Arena *local_78;
  Rep *local_70;
  size_t local_68;
  byte local_49;
  type_info local_48 [56];
  ulong local_10;
  Arena *local_8;
  
  local_e8[0] = in_RDI->current_size_ + in_ESI;
  if (in_RDI->total_size_ < local_e8[0]) {
    local_f0 = in_RDI->rep_;
    local_f8 = GetArena(in_RDI);
    local_fc = in_RDI->total_size_ << 1;
    piVar2 = std::max<int>(&local_fc,local_e8);
    piVar2 = std::max<int>(&kRepeatedFieldLowerClampLimit,piVar2);
    local_e8[0] = *piVar2;
    uVar3 = (ulong)local_e8[0];
    uVar4 = std::numeric_limits<unsigned_long>::max();
    if (uVar4 - 8 >> 3 < uVar3) {
      LogMessage::LogMessage
                (in_stack_fffffffffffffe30,(LogLevel)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                 (char *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c);
      LogMessage::operator<<
                (in_stack_fffffffffffffe20,
                 (char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      LogMessage::operator<<
                (in_stack_fffffffffffffe20,
                 (char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      LogFinisher::operator=
                ((LogFinisher *)in_stack_fffffffffffffe20,
                 (LogMessage *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      LogMessage::~LogMessage((LogMessage *)0x4238df);
    }
    uVar3 = (long)local_e8[0] * 8 + 8;
    if (local_f8 == (Arena *)0x0) {
      pRVar5 = (Rep *)operator_new(uVar3);
      in_RDI->rep_ = pRVar5;
    }
    else {
      local_78 = local_f8;
      local_80 = uVar3;
      uVar4 = std::numeric_limits<unsigned_long>::max();
      local_b9 = 0;
      if (uVar4 < uVar3) {
        LogMessage::LogMessage
                  (in_stack_fffffffffffffe30,(LogLevel)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                   (char *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c);
        local_b9 = 1;
        LogMessage::operator<<
                  (in_stack_fffffffffffffe20,
                   (char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
        LogMessage::operator<<
                  (in_stack_fffffffffffffe20,
                   (char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
        LogFinisher::operator=
                  ((LogFinisher *)in_stack_fffffffffffffe20,
                   (LogMessage *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      }
      if ((local_b9 & 1) != 0) {
        LogMessage::~LogMessage((LogMessage *)0x423a25);
      }
      uVar3 = local_80;
      if (local_78 == (Arena *)0x0) {
        local_70 = (Rep *)operator_new__(local_80);
      }
      else {
        local_8 = local_78;
        local_10 = local_80;
        uVar4 = std::numeric_limits<unsigned_long>::max();
        local_49 = 0;
        if (uVar4 < uVar3) {
          in_stack_fffffffffffffe28 = local_48;
          LogMessage::LogMessage
                    (in_stack_fffffffffffffe30,(LogLevel)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                     (char *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c);
          local_49 = 1;
          in_stack_fffffffffffffe30 =
               LogMessage::operator<<
                         (in_stack_fffffffffffffe20,
                          (char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
          in_stack_fffffffffffffe20 =
               LogMessage::operator<<
                         (in_stack_fffffffffffffe20,
                          (char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
          LogFinisher::operator=
                    ((LogFinisher *)in_stack_fffffffffffffe20,
                     (LogMessage *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
        }
        if ((local_49 & 1) != 0) {
          LogMessage::~LogMessage((LogMessage *)0x423b69);
        }
        local_68 = AlignUpTo8(local_10);
        ArenaImpl::RecordAlloc
                  ((ArenaImpl *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                   (size_t)in_stack_fffffffffffffe20);
        local_70 = (Rep *)Arena::AllocateAlignedTo<1ul>
                                    ((Arena *)in_stack_fffffffffffffe20,
                                     CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      }
      in_RDI->rep_ = local_70;
    }
    iVar1 = in_RDI->total_size_;
    in_RDI->total_size_ = local_e8[0];
    if ((local_f0 == (Rep *)0x0) || (local_f0->allocated_size < 1)) {
      in_RDI->rep_->allocated_size = 0;
    }
    else {
      memcpy(in_RDI->rep_->elements,local_f0->elements,(long)local_f0->allocated_size << 3);
      in_RDI->rep_->allocated_size = local_f0->allocated_size;
    }
    if (local_f8 == (Arena *)0x0) {
      operator_delete(local_f0,(long)iVar1 * 8 + 8);
    }
    local_d8 = in_RDI->rep_->elements + in_RDI->current_size_;
  }
  else {
    local_d8 = in_RDI->rep_->elements + in_RDI->current_size_;
  }
  return local_d8;
}

Assistant:

void** RepeatedPtrFieldBase::InternalExtend(int extend_amount) {
  int new_size = current_size_ + extend_amount;
  if (total_size_ >= new_size) {
    // N.B.: rep_ is non-NULL because extend_amount is always > 0, hence
    // total_size must be non-zero since it is lower-bounded by new_size.
    return &rep_->elements[current_size_];
  }
  Rep* old_rep = rep_;
  Arena* arena = GetArena();
  new_size = std::max(internal::kRepeatedFieldLowerClampLimit,
                      std::max(total_size_ * 2, new_size));
  GOOGLE_CHECK_LE(new_size, (std::numeric_limits<size_t>::max() - kRepHeaderSize) /
                         sizeof(old_rep->elements[0]))
      << "Requested size is too large to fit into size_t.";
  size_t bytes = kRepHeaderSize + sizeof(old_rep->elements[0]) * new_size;
  if (arena == NULL) {
    rep_ = reinterpret_cast<Rep*>(::operator new(bytes));
  } else {
    rep_ = reinterpret_cast<Rep*>(Arena::CreateArray<char>(arena, bytes));
  }
#if defined(__GXX_DELETE_WITH_SIZE__) || defined(__cpp_sized_deallocation)
  const int old_total_size = total_size_;
#endif
  total_size_ = new_size;
  if (old_rep && old_rep->allocated_size > 0) {
    memcpy(rep_->elements, old_rep->elements,
           old_rep->allocated_size * sizeof(rep_->elements[0]));
    rep_->allocated_size = old_rep->allocated_size;
  } else {
    rep_->allocated_size = 0;
  }
  if (arena == NULL) {
#if defined(__GXX_DELETE_WITH_SIZE__) || defined(__cpp_sized_deallocation)
    const size_t old_size =
        old_total_size * sizeof(rep_->elements[0]) + kRepHeaderSize;
    ::operator delete(static_cast<void*>(old_rep), old_size);
#else
    ::operator delete(static_cast<void*>(old_rep));
#endif
  }
  return &rep_->elements[current_size_];
}